

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_writer_writebinary(FILE *out,sylvan_skiplist_t sl)

{
  ulong *__ptr;
  ulong uVar1;
  size_t sVar2;
  MTBDD MVar3;
  long lVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  size_t i;
  ulong index;
  mtbddnode node;
  size_t nodecount;
  
  nodecount = sylvan_skiplist_count(sl);
  fwrite(&nodecount,8,1,(FILE *)out);
  sVar2 = nodecount;
  for (index = 1; index <= sVar2; index = index + 1) {
    MVar3 = sylvan_skiplist_getr(sl,index);
    lVar4 = (MVar3 & 0xffffffffff) * 0x10;
    __ptr = (ulong *)(nodes->data + lVar4);
    if ((nodes->data[lVar4 + 7] & 0x40) == 0) {
      uVar5 = sylvan_skiplist_get(sl,__ptr[1] & 0xffffffffff);
      uVar1 = *__ptr;
      uVar6 = sylvan_skiplist_get(sl,uVar1 & 0xffffffffff);
      node.a = uVar1 & 0x8000000000000000 ^ uVar6;
      node.b = __ptr[1] & 0xffffff0000000000 | uVar5;
      fwrite(&node,0x10,1,(FILE *)out);
    }
    else {
      fwrite(__ptr,0x10,1,(FILE *)out);
      sylvan_mt_write_binary((uint32_t)*__ptr,__ptr[1],out);
    }
  }
  return;
}

Assistant:

void
mtbdd_writer_writebinary(FILE *out, sylvan_skiplist_t sl)
{
    size_t nodecount = sylvan_skiplist_count(sl);
    fwrite(&nodecount, sizeof(size_t), 1, out);
    for (size_t i=1; i<=nodecount; i++) {
        MTBDD dd = sylvan_skiplist_getr(sl, i);

        mtbddnode_t n = MTBDD_GETNODE(dd);
        if (mtbddnode_isleaf(n)) {
            /* write leaf */
            fwrite(n, sizeof(struct mtbddnode), 1, out);
            uint32_t type = mtbddnode_gettype(n);
            uint64_t value = mtbddnode_getvalue(n);
            sylvan_mt_write_binary(type, value, out);
        } else {
            struct mtbddnode node;
            MTBDD low = sylvan_skiplist_get(sl, mtbddnode_getlow(n));
            MTBDD high = mtbddnode_gethigh(n);
            high = MTBDD_TRANSFERMARK(high, sylvan_skiplist_get(sl, MTBDD_STRIPMARK(high)));
            mtbddnode_makenode(&node, mtbddnode_getvariable(n), low, high);
            fwrite(&node, sizeof(struct mtbddnode), 1, out);
        }
    }
}